

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_action(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node_action **actions)

{
  lysp_node_action *plVar1;
  uint16_t uVar2;
  LY_ERR LVar3;
  lysp_node_action *parent_00;
  char *pcVar4;
  ly_stmt lVar5;
  char *pcVar6;
  ly_ctx *local_d0;
  ly_ctx *local_c8;
  ly_ctx *local_b8;
  ly_ctx *local_a8;
  ly_ctx *local_a0;
  LY_ERR ret___12;
  LY_ERR ret___11;
  LY_ERR ret___10;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  lysp_stmt *child;
  long *plStack_58;
  LY_ERR ret___1;
  char **iter__;
  size_t offset__;
  char *p__;
  LY_ERR ret__;
  lysp_node_action *act;
  lysp_node_action **actions_local;
  lysp_node *parent_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  ctx_local._4_4_ = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    parent_00 = (lysp_node_action *)calloc(1,0x110);
    if (parent_00 == (lysp_node_action *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        local_a0 = (ly_ctx *)0x0;
      }
      else {
        local_a0 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(local_a0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_action");
      ctx_local._4_4_ = LY_EMEM;
    }
    else {
      if (*actions == (lysp_node_action *)0x0) {
        *actions = parent_00;
      }
      else {
        plVar1 = *actions;
        while (plStack_58 = (long *)((long)plVar1 + (long)*actions + (0x10 - (long)*actions)),
              *plStack_58 != 0) {
          plVar1 = (lysp_node_action *)*plStack_58;
        }
        *plStack_58 = (long)parent_00;
      }
      if (ctx == (lysp_ctx *)0x0) {
        local_a8 = (ly_ctx *)0x0;
      }
      else {
        local_a8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ctx_local._4_4_ = lydict_insert(local_a8,stmt->arg,0,&(parent_00->field_0).node.name);
      if (ctx_local._4_4_ == LY_SUCCESS) {
        uVar2 = 0x100;
        if (parent != (lysp_node *)0x0) {
          uVar2 = 0x200;
        }
        (parent_00->field_0).node.nodetype = uVar2;
        (parent_00->field_0).node.parent = parent;
        for (_ret___3 = stmt->child; _ret___3 != (lysp_stmt *)0x0; _ret___3 = _ret___3->next) {
          lVar5 = _ret___3->kw;
          if (lVar5 == LY_STMT_INPUT) {
            LVar3 = lysp_stmt_inout(ctx,_ret___3,(lysp_node *)parent_00,&parent_00->input);
          }
          else if (lVar5 == LY_STMT_OUTPUT) {
            LVar3 = lysp_stmt_inout(ctx,_ret___3,(lysp_node *)parent_00,&parent_00->output);
          }
          else if (lVar5 == LY_STMT_GROUPING) {
            LVar3 = lysp_stmt_grouping(ctx,_ret___3,(lysp_node *)parent_00,&parent_00->groupings);
          }
          else if (lVar5 == LY_STMT_DESCRIPTION) {
            LVar3 = lysp_stmt_text_field
                              (ctx,_ret___3,0,&(parent_00->field_0).node.dsc,Y_STR_ARG,
                               &(parent_00->field_0).node.exts);
          }
          else if (lVar5 == LY_STMT_EXTENSION_INSTANCE) {
            lVar5 = LY_STMT_RPC;
            if (parent != (lysp_node *)0x0) {
              lVar5 = LY_STMT_ACTION;
            }
            LVar3 = lysp_stmt_ext(ctx,_ret___3,lVar5,0,&(parent_00->field_0).node.exts);
          }
          else if (lVar5 == LY_STMT_IF_FEATURE) {
            LVar3 = lysp_stmt_qnames(ctx,_ret___3,&(parent_00->field_0).node.iffeatures,Y_STR_ARG,
                                     &(parent_00->field_0).node.exts);
          }
          else if (lVar5 == LY_STMT_REFERENCE) {
            LVar3 = lysp_stmt_text_field
                              (ctx,_ret___3,0,&(parent_00->field_0).node.ref,Y_STR_ARG,
                               &(parent_00->field_0).node.exts);
          }
          else if (lVar5 == LY_STMT_STATUS) {
            LVar3 = lysp_stmt_status(ctx,_ret___3,&(parent_00->field_0).node.flags,
                                     &(parent_00->field_0).node.exts);
          }
          else {
            if (lVar5 != LY_STMT_TYPEDEF) {
              if (ctx == (lysp_ctx *)0x0) {
                local_b8 = (ly_ctx *)0x0;
              }
              else {
                local_b8 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar4 = lyplg_ext_stmt2str(_ret___3->kw);
              pcVar6 = "rpc";
              if (parent != (lysp_node *)0x0) {
                pcVar6 = "action";
              }
              ly_vlog(local_b8,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,pcVar6);
              return LY_EVALID;
            }
            LVar3 = lysp_stmt_typedef(ctx,_ret___3,(lysp_node *)parent_00,&parent_00->typedefs);
          }
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
        }
        if ((parent_00->input).field_0.node.nodetype == 0) {
          (parent_00->input).field_0.node.nodetype = 0x1000;
          (parent_00->input).field_0.node.parent = (lysp_node *)parent_00;
          if (ctx == (lysp_ctx *)0x0) {
            local_c8 = (ly_ctx *)0x0;
          }
          else {
            local_c8 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          LVar3 = lydict_insert(local_c8,"input",0,&(parent_00->input).field_0.node.name);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
        }
        if ((parent_00->output).field_0.node.nodetype == 0) {
          (parent_00->output).field_0.node.nodetype = 0x2000;
          (parent_00->output).field_0.node.parent = (lysp_node *)parent_00;
          if (ctx == (lysp_ctx *)0x0) {
            local_d0 = (ly_ctx *)0x0;
          }
          else {
            local_d0 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          LVar3 = lydict_insert(local_d0,"output",0,&(parent_00->output).field_0.node.name);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
        }
        ctx_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_action(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent,
        struct lysp_node_action **actions)
{
    struct lysp_node_action *act;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    LY_LIST_NEW_RET(PARSER_CTX(ctx), actions, act, next, LY_EMEM);

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &act->name));
    act->nodetype = parent ? LYS_ACTION : LYS_RPC;
    act->parent = parent;

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &act->dsc, Y_STR_ARG, &act->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &act->iffeatures, Y_STR_ARG, &act->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &act->ref, Y_STR_ARG, &act->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &act->flags, &act->exts));
            break;

        case LY_STMT_INPUT:
            LY_CHECK_RET(lysp_stmt_inout(ctx, child, &act->node, &act->input));
            break;
        case LY_STMT_OUTPUT:
            LY_CHECK_RET(lysp_stmt_inout(ctx, child, &act->node, &act->output));
            break;

        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(lysp_stmt_typedef(ctx, child, &act->node, &act->typedefs));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(lysp_stmt_grouping(ctx, child, &act->node, &act->groupings));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, parent ? LY_STMT_ACTION : LY_STMT_RPC, 0, &act->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), parent ? "action" : "rpc");
            return LY_EVALID;
        }
    }

    /* always initialize inout, they are technically present (needed for later deviations/refines) */
    if (!act->input.nodetype) {
        act->input.nodetype = LYS_INPUT;
        act->input.parent = &act->node;
        LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), "input", 0, &act->input.name));
    }
    if (!act->output.nodetype) {
        act->output.nodetype = LYS_OUTPUT;
        act->output.parent = &act->node;
        LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), "output", 0, &act->output.name));
    }

    return LY_SUCCESS;
}